

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCreateTable(Btree *p,Pgno *piTable,int flags)

{
  int iVar1;
  int rc;
  Btree *in_stack_00000018;
  
  sqlite3BtreeEnter((Btree *)0x185ce3);
  iVar1 = btreeCreateTable(in_stack_00000018,(Pgno *)p,piTable._4_4_);
  sqlite3BtreeLeave((Btree *)0x185d03);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, Pgno *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}